

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O0

Vec_Ptr_t * Amap_LibSelectGates(Amap_Lib_t *p,int fVerbose)

{
  void *__s2;
  int iVar1;
  Amap_Gat_t *pAVar2;
  Vec_Ptr_t *p_00;
  void *Entry;
  void *pvVar3;
  int local_38;
  int local_34;
  int k;
  int i;
  Amap_Gat_t *pGate2;
  Amap_Gat_t *pGate;
  Vec_Ptr_t *vSelect;
  int fVerbose_local;
  Amap_Lib_t *p_local;
  
  pAVar2 = Amap_LibFindGate(p,0);
  p->pGate0 = pAVar2;
  pAVar2 = Amap_LibFindGate(p,0xffffffff);
  p->pGate1 = pAVar2;
  pAVar2 = Amap_LibFindGate(p,0xaaaaaaaa);
  p->pGateBuf = pAVar2;
  pAVar2 = Amap_LibFindGate(p,0x55555555);
  p->pGateInv = pAVar2;
  p_00 = Vec_PtrAlloc(100);
  local_34 = 0;
  do {
    iVar1 = Vec_PtrSize(p->vSorted);
    if (iVar1 <= local_34) {
      return p_00;
    }
    Entry = Vec_PtrEntry(p->vSorted,local_34);
    if ((*(long *)((long)Entry + 0x30) != 0) && (*(long *)((long)Entry + 8) == 0)) {
      for (local_38 = 0; local_38 < local_34; local_38 = local_38 + 1) {
        pvVar3 = Vec_PtrEntry(p->vSorted,local_38);
        if (((*(long *)((long)pvVar3 + 0x30) != 0) && (*(long *)((long)pvVar3 + 8) == 0)) &&
           (*(uint *)((long)pvVar3 + 0x38) >> 0x18 == *(uint *)((long)Entry + 0x38) >> 0x18)) {
          pvVar3 = *(void **)((long)pvVar3 + 0x30);
          __s2 = *(void **)((long)Entry + 0x30);
          iVar1 = Abc_TruthWordNum(*(uint *)((long)Entry + 0x38) >> 0x18);
          iVar1 = memcmp(pvVar3,__s2,(long)iVar1 << 2);
          if (iVar1 == 0) break;
        }
      }
      if (local_34 <= local_38) {
        Vec_PtrPush(p_00,Entry);
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Amap_LibSelectGates( Amap_Lib_t * p, int fVerbose )
{
    Vec_Ptr_t * vSelect;
    Amap_Gat_t * pGate, * pGate2;
    int i, k;//, clk = Abc_Clock();
    p->pGate0   = Amap_LibFindGate( p, 0 );
    p->pGate1   = Amap_LibFindGate( p, ~0 );
    p->pGateBuf = Amap_LibFindGate( p, 0xAAAAAAAA );
    p->pGateInv = Amap_LibFindGate( p, ~0xAAAAAAAA );
    vSelect = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Amap_Gat_t *, p->vSorted, pGate, i )
    {
        if ( pGate->pFunc == NULL || pGate->pTwin != NULL )
            continue;
        Vec_PtrForEachEntryStop( Amap_Gat_t *, p->vSorted, pGate2, k, i )
        {
            if ( pGate2->pFunc == NULL || pGate2->pTwin != NULL )
                continue;
            if ( pGate2->nPins != pGate->nPins )
                continue;
            if ( !memcmp( pGate2->pFunc, pGate->pFunc, sizeof(unsigned) * Abc_TruthWordNum(pGate->nPins) ) )
                break;
        }
        if ( k < i )
            continue;
        Vec_PtrPush( vSelect, pGate );            
    }
    return vSelect;
}